

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlschemas.c
# Opt level: O1

xmlSchemaSAXPlugPtr
xmlSchemaSAXPlug(xmlSchemaValidCtxtPtr ctxt,xmlSAXHandlerPtr *sax,void **user_data)

{
  xmlSAXHandlerPtr pxVar1;
  xmlSchemaValidCtxtPtr __s;
  xmlSAXHandler *pxVar2;
  code *pcVar3;
  xmlSchemaValidCtxtPtr pxVar4;
  xmlSchemaValidCtxtPtr pxVar5;
  
  if ((user_data != (void **)0x0 &&
       (sax != (xmlSAXHandlerPtr *)0x0 && ctxt != (xmlSchemaValidCtxtPtr)0x0)) &&
     (((pxVar1 = *sax, pxVar1 == (xmlSAXHandlerPtr)0x0 ||
       ((pxVar1->initialized == 0xdeedbeaf &&
        (((pxVar1->startElementNs != (startElementNsSAX2Func)0x0 ||
          (pxVar1->endElementNs != (endElementNsSAX2Func)0x0)) ||
         ((pxVar1->startElement == (startElementSAXFunc)0x0 &&
          (pxVar1->endElement == (endElementSAXFunc)0x0)))))))) &&
      (__s = (xmlSchemaValidCtxtPtr)(*xmlMalloc)(0x130), __s != (xmlSchemaValidCtxtPtr)0x0)))) {
    memset(__s,0,0x130);
    pxVar2 = (xmlSAXHandler *)&__s->schema;
    __s->type = 0xdc43ba21;
    __s->nbIdcKeys = 0xdeedbeaf;
    *(xmlSchemaValidCtxtPtr *)&__s->nbAttrInfos = ctxt;
    __s->errCtxt = sax;
    __s->error = (xmlSchemaValidityErrorFunc)pxVar1;
    if (pxVar1 == (xmlSAXHandlerPtr)0x0) {
      __s->dict = (xmlDictPtr)xmlSchemaSAXHandleStartElementNs;
      __s->reader = (xmlTextReaderPtr)xmlSchemaSAXHandleEndElementNs;
      *(code **)&__s->sizeElemInfos = xmlSchemaSAXHandleText;
      __s->elemInfos = (xmlSchemaNodeInfoPtr *)xmlSchemaSAXHandleText;
      *(code **)&__s->nbIdcNodes = xmlSchemaSAXHandleCDataSection;
      *(code **)&__s->xsiAssemble = xmlSchemaSAXHandleReference;
      pxVar4 = ctxt;
      pxVar5 = ctxt;
    }
    else {
      if (pxVar1->internalSubset != (internalSubsetSAXFunc)0x0) {
        pxVar2->internalSubset = internalSubsetSplit;
      }
      if (pxVar1->isStandalone != (isStandaloneSAXFunc)0x0) {
        __s->doc = (xmlDocPtr)isStandaloneSplit;
      }
      if (pxVar1->hasInternalSubset != (hasInternalSubsetSAXFunc)0x0) {
        __s->input = (xmlParserInputBufferPtr)hasInternalSubsetSplit;
      }
      if (pxVar1->hasExternalSubset != (hasExternalSubsetSAXFunc)0x0) {
        *(code **)&__s->enc = hasExternalSubsetSplit;
      }
      if (pxVar1->resolveEntity != (resolveEntitySAXFunc)0x0) {
        __s->sax = (xmlSAXHandlerPtr)resolveEntitySplit;
      }
      if (pxVar1->getEntity != (getEntitySAXFunc)0x0) {
        __s->parserCtxt = (xmlParserCtxtPtr)getEntitySplit;
      }
      if (pxVar1->entityDecl != (entityDeclSAXFunc)0x0) {
        __s->user_data = entityDeclSplit;
      }
      if (pxVar1->notationDecl != (notationDeclSAXFunc)0x0) {
        __s->filename = (char *)notationDeclSplit;
      }
      if (pxVar1->attributeDecl != (attributeDeclSAXFunc)0x0) {
        *(code **)&__s->err = attributeDeclSplit;
      }
      if (pxVar1->elementDecl != (elementDeclSAXFunc)0x0) {
        __s->node = (xmlNodePtr)elementDeclSplit;
      }
      if (pxVar1->unparsedEntityDecl != (unparsedEntityDeclSAXFunc)0x0) {
        __s->cur = (xmlNodePtr)unparsedEntityDeclSplit;
      }
      if (pxVar1->setDocumentLocator != (setDocumentLocatorSAXFunc)0x0) {
        __s->regexp = (xmlRegExecCtxtPtr)setDocumentLocatorSplit;
      }
      if (pxVar1->startDocument != (startDocumentSAXFunc)0x0) {
        __s->value = (xmlSchemaValPtr)startDocumentSplit;
      }
      if (pxVar1->endDocument != (endDocumentSAXFunc)0x0) {
        *(code **)&__s->valueWS = endDocumentSplit;
      }
      if (pxVar1->processingInstruction != (processingInstructionSAXFunc)0x0) {
        __s->inode = (xmlSchemaNodeInfoPtr)processingInstructionSplit;
      }
      if (pxVar1->comment != (commentSAXFunc)0x0) {
        __s->aidcs = (xmlSchemaIDCAugPtr_conflict)commentSplit;
      }
      if (pxVar1->warning != (warningSAXFunc)0x0) {
        __s->xpathStates = (xmlSchemaIDCStateObjPtr_conflict)warningSplit;
      }
      if (pxVar1->error != (errorSAXFunc)0x0) {
        __s->xpathStatePool = (xmlSchemaIDCStateObjPtr_conflict)errorSplit;
      }
      if (pxVar1->fatalError != (fatalErrorSAXFunc)0x0) {
        __s->idcMatcherCache = (xmlSchemaIDCMatcherPtr_conflict)fatalErrorSplit;
      }
      if (pxVar1->getParameterEntity != (getParameterEntitySAXFunc)0x0) {
        __s->idcNodes = (xmlSchemaPSVIIDCNodePtr *)getParameterEntitySplit;
      }
      if (pxVar1->externalSubset != (externalSubsetSAXFunc)0x0) {
        __s->idcKeys = (xmlSchemaPSVIIDCKeyPtr *)externalSubsetSplit;
      }
      pcVar3 = charactersSplit;
      __s->elemInfos = (xmlSchemaNodeInfoPtr *)charactersSplit;
      if ((pxVar1->ignorableWhitespace != (ignorableWhitespaceSAXFunc)0x0) &&
         (pxVar1->ignorableWhitespace != pxVar1->characters)) {
        pcVar3 = ignorableWhitespaceSplit;
      }
      *(code **)&__s->sizeElemInfos = pcVar3;
      *(code **)&__s->nbIdcNodes = cdataBlockSplit;
      *(code **)&__s->xsiAssemble = referenceSplit;
      __s->dict = (xmlDictPtr)startElementNsSplit;
      __s->reader = (xmlTextReaderPtr)endElementNsSplit;
      __s->warning = (xmlSchemaValidityWarningFunc)user_data;
      pxVar4 = (xmlSchemaValidCtxtPtr)*user_data;
      pxVar5 = __s;
    }
    __s->serror = (xmlStructuredErrorFunc)pxVar4;
    *user_data = pxVar5;
    *sax = pxVar2;
    ctxt->sax = pxVar2;
    *(byte *)&ctxt->flags = (byte)ctxt->flags | 1;
    xmlSchemaPreRun(ctxt);
    return (xmlSchemaSAXPlugPtr)__s;
  }
  return (xmlSchemaSAXPlugPtr)0x0;
}

Assistant:

xmlSchemaSAXPlugPtr
xmlSchemaSAXPlug(xmlSchemaValidCtxtPtr ctxt,
		 xmlSAXHandlerPtr *sax, void **user_data)
{
    xmlSchemaSAXPlugPtr ret;
    xmlSAXHandlerPtr old_sax;

    if ((ctxt == NULL) || (sax == NULL) || (user_data == NULL))
        return(NULL);

    /*
     * We only allow to plug into SAX2 event streams
     */
    old_sax = *sax;
    if ((old_sax != NULL) && (old_sax->initialized != XML_SAX2_MAGIC))
        return(NULL);
    if ((old_sax != NULL) &&
        (old_sax->startElementNs == NULL) && (old_sax->endElementNs == NULL) &&
        ((old_sax->startElement != NULL) || (old_sax->endElement != NULL)))
        return(NULL);

    /*
     * everything seems right allocate the local data needed for that layer
     */
    ret = (xmlSchemaSAXPlugPtr) xmlMalloc(sizeof(xmlSchemaSAXPlugStruct));
    if (ret == NULL) {
        return(NULL);
    }
    memset(ret, 0, sizeof(xmlSchemaSAXPlugStruct));
    ret->magic = XML_SAX_PLUG_MAGIC;
    ret->schemas_sax.initialized = XML_SAX2_MAGIC;
    ret->ctxt = ctxt;
    ret->user_sax_ptr = sax;
    ret->user_sax = old_sax;
    if (old_sax == NULL) {
        /*
	 * go direct, no need for the split block and functions.
	 */
	ret->schemas_sax.startElementNs = xmlSchemaSAXHandleStartElementNs;
	ret->schemas_sax.endElementNs = xmlSchemaSAXHandleEndElementNs;
	/*
	 * Note that we use the same text-function for both, to prevent
	 * the parser from testing for ignorable whitespace.
	 */
	ret->schemas_sax.ignorableWhitespace = xmlSchemaSAXHandleText;
	ret->schemas_sax.characters = xmlSchemaSAXHandleText;

	ret->schemas_sax.cdataBlock = xmlSchemaSAXHandleCDataSection;
	ret->schemas_sax.reference = xmlSchemaSAXHandleReference;

	ret->user_data = ctxt;
	*user_data = ctxt;
    } else {
       /*
        * for each callback unused by Schemas initialize it to the Split
	* routine only if non NULL in the user block, this can speed up
	* things at the SAX level.
	*/
        if (old_sax->internalSubset != NULL)
            ret->schemas_sax.internalSubset = internalSubsetSplit;
        if (old_sax->isStandalone != NULL)
            ret->schemas_sax.isStandalone = isStandaloneSplit;
        if (old_sax->hasInternalSubset != NULL)
            ret->schemas_sax.hasInternalSubset = hasInternalSubsetSplit;
        if (old_sax->hasExternalSubset != NULL)
            ret->schemas_sax.hasExternalSubset = hasExternalSubsetSplit;
        if (old_sax->resolveEntity != NULL)
            ret->schemas_sax.resolveEntity = resolveEntitySplit;
        if (old_sax->getEntity != NULL)
            ret->schemas_sax.getEntity = getEntitySplit;
        if (old_sax->entityDecl != NULL)
            ret->schemas_sax.entityDecl = entityDeclSplit;
        if (old_sax->notationDecl != NULL)
            ret->schemas_sax.notationDecl = notationDeclSplit;
        if (old_sax->attributeDecl != NULL)
            ret->schemas_sax.attributeDecl = attributeDeclSplit;
        if (old_sax->elementDecl != NULL)
            ret->schemas_sax.elementDecl = elementDeclSplit;
        if (old_sax->unparsedEntityDecl != NULL)
            ret->schemas_sax.unparsedEntityDecl = unparsedEntityDeclSplit;
        if (old_sax->setDocumentLocator != NULL)
            ret->schemas_sax.setDocumentLocator = setDocumentLocatorSplit;
        if (old_sax->startDocument != NULL)
            ret->schemas_sax.startDocument = startDocumentSplit;
        if (old_sax->endDocument != NULL)
            ret->schemas_sax.endDocument = endDocumentSplit;
        if (old_sax->processingInstruction != NULL)
            ret->schemas_sax.processingInstruction = processingInstructionSplit;
        if (old_sax->comment != NULL)
            ret->schemas_sax.comment = commentSplit;
        if (old_sax->warning != NULL)
            ret->schemas_sax.warning = warningSplit;
        if (old_sax->error != NULL)
            ret->schemas_sax.error = errorSplit;
        if (old_sax->fatalError != NULL)
            ret->schemas_sax.fatalError = fatalErrorSplit;
        if (old_sax->getParameterEntity != NULL)
            ret->schemas_sax.getParameterEntity = getParameterEntitySplit;
        if (old_sax->externalSubset != NULL)
            ret->schemas_sax.externalSubset = externalSubsetSplit;

	/*
	 * the 6 schemas callback have to go to the splitter functions
	 * Note that we use the same text-function for ignorableWhitespace
	 * if possible, to prevent the parser from testing for ignorable
	 * whitespace.
	 */
        ret->schemas_sax.characters = charactersSplit;
	if ((old_sax->ignorableWhitespace != NULL) &&
	    (old_sax->ignorableWhitespace != old_sax->characters))
	    ret->schemas_sax.ignorableWhitespace = ignorableWhitespaceSplit;
	else
	    ret->schemas_sax.ignorableWhitespace = charactersSplit;
        ret->schemas_sax.cdataBlock = cdataBlockSplit;
        ret->schemas_sax.reference = referenceSplit;
        ret->schemas_sax.startElementNs = startElementNsSplit;
        ret->schemas_sax.endElementNs = endElementNsSplit;

	ret->user_data_ptr = user_data;
	ret->user_data = *user_data;
	*user_data = ret;
    }

    /*
     * plug the pointers back.
     */
    *sax = &(ret->schemas_sax);
    ctxt->sax = *sax;
    ctxt->flags |= XML_SCHEMA_VALID_CTXT_FLAG_STREAM;
    xmlSchemaPreRun(ctxt);
    return(ret);
}